

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ZSTD_compressionParameters ZVar4;
  uint uVar5;
  unsigned_long_long uVar6;
  
  ZVar4 = cPar;
  if ((((0xffffffe9 < cPar.windowLog - 0x20) && (0xffffffe6 < cPar.chainLog - 0x1f)) &&
      (0xffffffe6 < cPar.hashLog - 0x1f)) &&
     (((0xffffffe1 < cPar.searchLog - 0x1f && (cPar.minMatch - 3 < 5)) &&
      ((cPar.targetLength < 0x20001 && (cPar.strategy - ZSTD_fast < 9)))))) {
    uVar6 = 0x201;
    if (dictSize == 0) {
      uVar6 = srcSize;
    }
    if (srcSize != 0xffffffffffffffff) {
      uVar6 = srcSize;
    }
    if ((uVar6 | dictSize) < 0x40000000) {
      uVar5 = 6;
      if (0x3f < uVar6 + dictSize) {
        uVar5 = (int)(uVar6 + dictSize) - 1;
        if (uVar5 == 0) {
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x12c2,"U32 ZSTD_highbit32(U32)");
        }
        uVar1 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        uVar5 = (uVar1 ^ 0xffffffe0) + 0x21;
      }
      if (uVar5 < cPar.windowLog) {
        cPar.windowLog = uVar5;
      }
    }
    if (cPar.windowLog + 1 < cPar.hashLog) {
      cPar.hashLog = cPar.windowLog + 1;
    }
    if (cPar.windowLog < (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2)) {
      cPar.chainLog = (cPar.windowLog + 1) - (uint)(cPar.strategy < ZSTD_btlazy2);
    }
    if (cPar.windowLog < 10) {
      cPar.windowLog = 10;
    }
    uVar2 = ZVar4._12_8_;
    uVar3 = ZVar4._20_8_;
    __return_storage_ptr__->searchLog = (int)uVar2;
    __return_storage_ptr__->minMatch = (int)((ulong)uVar2 >> 0x20);
    __return_storage_ptr__->targetLength = (int)uVar3;
    __return_storage_ptr__->strategy = (int)((ulong)uVar3 >> 0x20);
    __return_storage_ptr__->windowLog = cPar.windowLog;
    __return_storage_ptr__->chainLog = cPar.chainLog;
    __return_storage_ptr__->hashLog = cPar.hashLog;
    __return_storage_ptr__->searchLog = cPar.searchLog;
    return __return_storage_ptr__;
  }
  __assert_fail("ZSTD_checkCParams(cPar)==0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2e4f,
                "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t)"
               );
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
        srcSize = minSrcSize;

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog+1) cPar.hashLog = cPar.windowLog+1;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    return cPar;
}